

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::makeCompositeConstant(Builder *this,Id typeId,Vector<Id> *members,bool specConstant)

{
  pointer *pppIVar1;
  Op typeClass;
  iterator __position;
  Id IVar2;
  pointer puVar3;
  undefined7 in_register_00000009;
  iterator __position_00;
  vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *this_00;
  Op OVar4;
  long lVar5;
  ulong uVar6;
  Instruction *c;
  Instruction *local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  OVar4 = OpConstantComposite;
  if ((int)CONCAT71(in_register_00000009,specConstant) != 0) {
    OVar4 = OpSpecConstantComposite;
  }
  if (typeId == 0) {
    __assert_fail("typeId",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x3ce,
                  "Id spv::Builder::makeCompositeConstant(Id, const dxil_spv::Vector<Id> &, bool)");
  }
  typeClass = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start[typeId]->opCode;
  uVar6 = (ulong)typeClass;
  if (((0x1e < uVar6) || ((0x51800000U >> (typeClass & OpTypeOpaque) & 1) == 0)) &&
     (typeClass != OpTypeCooperativeMatrixKHR)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x3d9,
                  "Id spv::Builder::makeCompositeConstant(Id, const dxil_spv::Vector<Id> &, bool)");
  }
  if ((!specConstant) && (IVar2 = findCompositeConstant(this,typeClass,members), IVar2 != 0)) {
    return IVar2;
  }
  local_40 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  local_40->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
  local_40->resultId = IVar2;
  local_40->typeId = typeId;
  local_40->opCode = OVar4;
  (local_40->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_40->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_40->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40->block = (Block *)0x0;
  puVar3 = (members->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(members->
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2)) {
    lVar5 = 0;
    do {
      local_38._M_head_impl._0_4_ = puVar3[lVar5];
      __position._M_current =
           (local_40->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_40->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &local_40->operands,__position,(uint *)&local_38);
      }
      else {
        *__position._M_current = puVar3[lVar5];
        (local_40->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar5 = lVar5 + 1;
      puVar3 = (members->
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (lVar5 < (int)((ulong)((long)(members->
                                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)
                          >> 2));
  }
  local_38._M_head_impl = local_40;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  if (typeClass == OpTypeCooperativeMatrixKHR) {
    __position_00._M_current =
         (this->coopmatConstants).
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current !=
        (this->coopmatConstants).
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      *__position_00._M_current = local_40;
      pppIVar1 = &(this->coopmatConstants).
                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
      goto LAB_001b7d76;
    }
    this_00 = (vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
              &this->coopmatConstants;
  }
  else {
    this_00 = (vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
              (this->groupedConstants + uVar6);
    __position_00._M_current =
         this->groupedConstants[uVar6].
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current !=
        this->groupedConstants[uVar6].
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      *__position_00._M_current = local_40;
      pppIVar1 = &this->groupedConstants[uVar6].
                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
      goto LAB_001b7d76;
    }
  }
  std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
  _M_realloc_insert<spv::Instruction*const&>(this_00,__position_00,&local_40);
LAB_001b7d76:
  Module::mapInstruction(&this->module,local_40);
  return local_40->resultId;
}

Assistant:

Id Builder::makeCompositeConstant(Id typeId, const dxil_spv::Vector<Id>& members, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstantComposite : OpConstantComposite;
    assert(typeId);
    Op typeClass = getTypeClass(typeId);

    switch (typeClass) {
    case OpTypeVector:
    case OpTypeArray:
    case OpTypeStruct:
    case OpTypeMatrix:
    case OpTypeCooperativeMatrixKHR:
        break;
    default:
        assert(0);
        return makeFloatConstant(0.0);
    }

    if (! specConstant) {
        Id existing = findCompositeConstant(typeClass, members);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    for (int op = 0; op < (int)members.size(); ++op)
        c->addIdOperand(members[op]);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));

    if (typeClass == OpTypeCooperativeMatrixKHR)
        coopmatConstants.push_back(c);
    else
        groupedConstants[typeClass].push_back(c);

    module.mapInstruction(c);

    return c->getResultId();
}